

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  j_compress_ptr in_RSI;
  long in_RDI;
  int v;
  int kex;
  int ke;
  int k;
  int tbl;
  uchar *st;
  JBLOCKROW block;
  arith_entropy_ptr entropy;
  int local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  jpeg_error_mgr *pjVar4;
  int val;
  uchar *st_00;
  
  st_00 = *(uchar **)(in_RDI + 0x1f0);
  if (*(int *)(in_RDI + 0x118) != 0) {
    if (*(int *)(st_00 + 0x60) == 0) {
      emit_restart((j_compress_ptr)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      *(undefined4 *)(st_00 + 0x60) = *(undefined4 *)(in_RDI + 0x118);
      *(int *)(st_00 + 100) = *(int *)(st_00 + 100) + 1;
      *(uint *)(st_00 + 100) = *(uint *)(st_00 + 100) & 7;
    }
    *(int *)(st_00 + 0x60) = *(int *)(st_00 + 0x60) + -1;
  }
  pjVar4 = in_RSI->err;
  for (iVar2 = *(int *)(in_RDI + 0x1a0); local_38 = iVar2, 0 < iVar2; iVar2 = iVar2 + -1) {
    iVar1 = (int)*(short *)((long)&pjVar4->error_exit + (long)jpeg_natural_order[iVar2] * 2);
    if (iVar1 < 0) {
      iVar1 = -iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    }
    else {
      iVar1 = iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
    }
    if (iVar1 != 0) break;
  }
  do {
    if (local_38 < 1) break;
    iVar1 = (int)*(short *)((long)&pjVar4->error_exit + (long)jpeg_natural_order[local_38] * 2);
    if (iVar1 < 0) {
      iVar1 = -iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a4) & 0x1f);
    }
    else {
      iVar1 = iVar1 >> ((byte)*(undefined4 *)(in_RDI + 0x1a4) & 0x1f);
    }
    if (iVar1 != 0) break;
    local_38 = local_38 + -1;
  } while( true );
  iVar1 = *(int *)(in_RDI + 0x19c);
LAB_001749d9:
  iVar3 = (int)((ulong)pjVar4 >> 0x20);
  if (iVar2 < iVar1) {
    if (iVar1 <= *(int *)(in_RDI + 0x1a0)) {
      arith_encode(in_RSI,st_00,iVar3);
    }
    return 1;
  }
  if (local_38 < iVar1) {
    arith_encode(in_RSI,st_00,iVar3);
  }
  do {
    iVar3 = (int)*(short *)((long)&pjVar4->error_exit + (long)jpeg_natural_order[iVar1] * 2);
    val = (int)((ulong)pjVar4 >> 0x20);
    if (iVar3 < 0) {
      iVar3 = -iVar3 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
      if (iVar3 != 0) break;
    }
    else {
      iVar3 = iVar3 >> ((byte)*(undefined4 *)(in_RDI + 0x1a8) & 0x1f);
      if (iVar3 != 0) {
        if (iVar3 >> 1 == 0) {
          arith_encode(in_RSI,st_00,val);
          arith_encode(in_RSI,st_00,(int)((ulong)pjVar4 >> 0x20));
        }
        else {
          arith_encode(in_RSI,st_00,val);
        }
        goto LAB_00174b7d;
      }
    }
    arith_encode(in_RSI,st_00,val);
    iVar1 = iVar1 + 1;
  } while( true );
  if (iVar3 >> 1 == 0) {
    arith_encode(in_RSI,st_00,val);
    arith_encode(in_RSI,st_00,(int)((ulong)pjVar4 >> 0x20));
  }
  else {
    arith_encode(in_RSI,st_00,val);
  }
LAB_00174b7d:
  iVar1 = iVar1 + 1;
  goto LAB_001749d9;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;
  register int temp, r, idx;
  char *BR_buffer;
  unsigned int BR;
  int Sl = cinfo->Se - cinfo->Ss + 1;
  int Al = cinfo->Al;
  JCOEF absvalues_unaligned[DCTSIZE2 + 15];
  JCOEF *absvalues;
  const JCOEF *cabsvalue, *EOBPTR;
  size_t zerobits, signbits;
  size_t bits[16 / SIZEOF_SIZE_T];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart(entropy, entropy->next_restart_num);

#ifdef WITH_SIMD
  cabsvalue = absvalues = (JCOEF *)PAD((JUINTPTR)absvalues_unaligned, 16);
#else
  /* Not using SIMD, so alignment is not needed */
  cabsvalue = absvalues = absvalues_unaligned;
#endif

  /* Prepare data */
  EOBPTR = absvalues +
    entropy->AC_refine_prepare(MCU_data[0][0], jpeg_natural_order + cinfo->Ss,
                               Sl, Al, absvalues, bits);

  /* Encode the AC coefficients per section G.1.2.3, fig. G.7 */

  r = 0;                        /* r = run length of zeros */
  BR = 0;                       /* BR = count of buffered bits added now */
  BR_buffer = entropy->bit_buffer + entropy->BE; /* Append bits to buffer */

  zerobits = bits[0];
#if SIZEOF_SIZE_T == 8
  signbits = bits[1];
#else
  signbits = bits[2];
#endif
  ENCODE_COEFS_AC_REFINE((void)0;);

#if SIZEOF_SIZE_T == 4
  zerobits = bits[1];
  signbits = bits[3];

  if (zerobits) {
    int diff = ((absvalues + DCTSIZE2 / 2) - cabsvalue);
    idx = count_zeroes(&zerobits);
    signbits >>= idx;
    idx += diff;
    r += idx;
    cabsvalue += idx;
    goto first_iter_ac_refine;
  }

  ENCODE_COEFS_AC_REFINE(first_iter_ac_refine:);
#endif

  r |= (int)((absvalues + Sl) - cabsvalue);

  if (r > 0 || BR > 0) {        /* If there are trailing zeroes, */
    entropy->EOBRUN++;          /* count an EOB */
    entropy->BE += BR;          /* concat my correction bits to older ones */
    /* We force out the EOB if we risk either:
     * 1. overflow of the EOB counter;
     * 2. overflow of the correction bit buffer during the next MCU.
     */
    if (entropy->EOBRUN == 0x7FFF ||
        entropy->BE > (MAX_CORR_BITS - DCTSIZE2 + 1))
      emit_eobrun(entropy);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}